

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_lock(Integer mutex)

{
  long in_RDI;
  int p;
  int m;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  
  if (GAnproc != 1) {
    if (num_mutexes < in_RDI) {
      pnga_error(in_stack_00000190,in_stack_00000188);
    }
    ARMCI_Lock(0,0x248409);
  }
  return;
}

Assistant:

void pnga_lock(Integer mutex)
{
int m,p;

   if(GAnproc == 1) return;
   if(num_mutexes< mutex)pnga_error("invalid mutex",mutex);

   p = num_mutexes/chunk_mutex -1;
   m = num_mutexes%chunk_mutex;

   ARMCI_Lock(m,p);
}